

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

char * add_file_name_to_url(char *url,char *filename)

{
  char *pcVar1;
  long lVar2;
  CURL *pCVar3;
  char *pcVar4;
  long lVar5;
  char *local_58;
  char *local_50;
  char *urlbuffer;
  char *encfile;
  char *file2;
  char *filep;
  CURL *curl;
  char *ptr;
  char *filename_local;
  char *url_local;
  
  pcVar1 = strstr(url,"://");
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    url_local = (char *)0x0;
  }
  else {
    curl = (CURL *)url;
    if (pcVar1 != (char *)0x0) {
      curl = (CURL *)(pcVar1 + 3);
    }
    pCVar3 = (CURL *)strrchr((char *)curl,0x2f);
    curl = pCVar3;
    filename_local = url;
    if ((pCVar3 == (CURL *)0x0) || (curl = pCVar3 + 1, pCVar3[1] == (CURL)0x0)) {
      pcVar1 = strrchr(filename,0x2f);
      local_58 = filename;
      if (pcVar1 != (char *)0x0) {
        local_58 = pcVar1;
      }
      pcVar4 = strrchr(local_58,0x5c);
      if (pcVar4 == (char *)0x0) {
        file2 = filename;
        if (pcVar1 != (char *)0x0) {
          file2 = pcVar1 + 1;
        }
      }
      else {
        file2 = pcVar4 + 1;
      }
      lVar5 = curl_easy_escape(lVar2,file2,0);
      if (lVar5 != 0) {
        if (curl == (CURL *)0x0) {
          local_50 = (char *)curl_maprintf("%s/%s",url,lVar5);
        }
        else {
          local_50 = (char *)curl_maprintf("%s%s",url,lVar5);
        }
        curl_free(lVar5);
        if (local_50 == (char *)0x0) {
          filename_local = (char *)0x0;
        }
        else {
          free(url);
          filename_local = local_50;
        }
      }
    }
    curl_easy_cleanup(lVar2);
    url_local = filename_local;
  }
  return url_local;
}

Assistant:

char *add_file_name_to_url(char *url, const char *filename)
{
  /* If no file name part is given in the URL, we add this file name */
  char *ptr = strstr(url, "://");
  CURL *curl = curl_easy_init(); /* for url escaping */
  if(!curl)
    return NULL; /* error! */
  if(ptr)
    ptr += 3;
  else
    ptr = url;
  ptr = strrchr(ptr, '/');
  if(!ptr || !*++ptr) {
    /* The URL has no file name part, add the local file name. In order
       to be able to do so, we have to create a new URL in another
       buffer.*/

    /* We only want the part of the local path that is on the right
       side of the rightmost slash and backslash. */
    const char *filep = strrchr(filename, '/');
    char *file2 = strrchr(filep?filep:filename, '\\');
    char *encfile;

    if(file2)
      filep = file2 + 1;
    else if(filep)
      filep++;
    else
      filep = filename;

    /* URL encode the file name */
    encfile = curl_easy_escape(curl, filep, 0 /* use strlen */);
    if(encfile) {
      char *urlbuffer;
      if(ptr)
        /* there is a trailing slash on the URL */
        urlbuffer = aprintf("%s%s", url, encfile);
      else
        /* there is no trailing slash on the URL */
        urlbuffer = aprintf("%s/%s", url, encfile);

      curl_free(encfile);

      if(!urlbuffer) {
        url = NULL;
        goto end;
      }

      Curl_safefree(url);
      url = urlbuffer; /* use our new URL instead! */
    }
  }
  end:
  curl_easy_cleanup(curl);
  return url;
}